

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

void Abc_SuppGenSelectVar(Vec_Wrd_t *p,int nBits,int iVar)

{
  ulong *puVar1;
  ulong *puVar2;
  
  if (0 < (long)p->nSize) {
    puVar2 = p->pArray;
    puVar1 = puVar2 + p->nSize;
    do {
      if ((*puVar2 & 1L << ((byte)iVar & 0x3f)) != 0) {
        *puVar2 = *puVar2 ^ 1L << ((byte)nBits & 0x3f);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 < puVar1);
  }
  return;
}

Assistant:

void Abc_SuppGenSelectVar( Vec_Wrd_t * p, int nBits, int iVar )
{
    word * pEntry = Vec_WrdArray(p);
    word * pLimit = Vec_WrdLimit(p);
    for ( ; pEntry < pLimit; pEntry++ )
        if ( (*pEntry >> iVar) & 1 )
            *pEntry ^= (((word)1) << nBits);
}